

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Cluster::AddFrame
          (Cluster *this,uint8_t *data,uint64_t length,uint64_t track_number,uint64_t abs_timecode,
          bool is_key)

{
  bool bVar1;
  uint64_t in_RCX;
  uint64_t in_R8;
  byte in_R9B;
  Frame *in_stack_00000020;
  Frame frame;
  uint64_t in_stack_ffffffffffffff48;
  Frame *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Frame local_a0;
  byte local_31;
  uint64_t local_30;
  uint64_t local_28;
  bool local_1;
  
  local_31 = in_R9B & 1;
  local_30 = in_R8;
  local_28 = in_RCX;
  Frame::Frame(&local_a0);
  bVar1 = Frame::Init((Frame *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      (uint8_t *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (bVar1) {
    Frame::set_track_number(&local_a0,local_28);
    Frame::set_timestamp(&local_a0,local_30);
    Frame::set_is_key(&local_a0,(bool)(local_31 & 1));
    local_1 = QueueOrWriteFrame((Cluster *)frame.add_id_,in_stack_00000020);
  }
  else {
    local_1 = false;
  }
  Frame::~Frame(in_stack_ffffffffffffff50);
  return (bool)(local_1 & 1);
}

Assistant:

bool Cluster::AddFrame(const uint8_t* data, uint64_t length,
                       uint64_t track_number, uint64_t abs_timecode,
                       bool is_key) {
  Frame frame;
  if (!frame.Init(data, length))
    return false;
  frame.set_track_number(track_number);
  frame.set_timestamp(abs_timecode);
  frame.set_is_key(is_key);
  return QueueOrWriteFrame(&frame);
}